

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O1

void Saig_ManPrintConeOne(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  uint *__ptr;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  Vec_Ptr_t *vNodes_00;
  uint uVar12;
  long lVar13;
  int local_54;
  ulong local_50;
  
  if (((*(uint *)&pObj->field_0x18 & 7) != 3) || (p->nTruePos <= (pObj->field_0).CioId)) {
    __assert_fail("Saig_ObjIsPo(p, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigCone.c"
                  ,0x6b,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  vNodes->nSize = 1;
  *ppvVar3 = pObj;
  pVVar4 = Saig_ManSupport(p,vNodes);
  vNodes->nSize = 0;
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    __assert_fail("!Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                  ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
  }
  printf("    PO %3d  ",(ulong)(uint)(pObj->field_0).CioId);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar5 = malloc(800);
  *(void **)(__ptr + 2) = pvVar5;
  uVar10 = 0;
  while( true ) {
    vNodes_00 = pVVar4;
    uVar8 = (ulong)(uint)vNodes_00->nSize;
    uVar12 = 0;
    local_50 = 0;
    local_54 = 0;
    if (0 < vNodes_00->nSize) break;
LAB_00647f6c:
    if ((int)local_50 + uVar12 + local_54 != (int)uVar8) {
      __assert_fail("nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigCone.c"
                    ,0x85,"void Saig_ManPrintConeOne(Aig_Man_t *, Aig_Obj_t *)");
    }
    printf("%d:%d %d=%d+%d+%d  ",(ulong)uVar10,(ulong)__ptr[1],uVar8,(ulong)uVar12,local_50,local_54
          );
    if (uVar12 == 0) {
      putchar(10);
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (void **)0x0;
      }
      if (vNodes != (Vec_Ptr_t *)0x0) {
        free(vNodes);
      }
      if (vNodes_00->pArray != (void **)0x0) {
        free(vNodes_00->pArray);
        vNodes_00->pArray = (void **)0x0;
      }
      if (vNodes_00 != (Vec_Ptr_t *)0x0) {
        free(vNodes_00);
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      return;
    }
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (void **)0x0;
    }
    if (vNodes != (Vec_Ptr_t *)0x0) {
      free(vNodes);
    }
    pVVar4 = Saig_ManSupport(p,vNodes_00);
    uVar10 = uVar10 + 1;
    vNodes = vNodes_00;
  }
  lVar13 = 0;
  local_54 = 0;
  local_50 = 0;
  uVar12 = 0;
LAB_00647e70:
  pvVar5 = vNodes_00->pArray[lVar13];
  uVar1 = __ptr[1];
  lVar11 = (long)(int)uVar1;
  if (0 < lVar11) {
    lVar7 = 0;
    do {
      if (*(void **)(*(long *)(__ptr + 2) + lVar7 * 8) == pvVar5) {
        if ((long)vNodes->nSize < 1) goto LAB_00647ed7;
        lVar11 = 0;
        goto LAB_00647ec9;
      }
      lVar7 = lVar7 + 1;
    } while (lVar11 != lVar7);
  }
  uVar2 = *__ptr;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar6 = malloc(0x80);
      }
      else {
        pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
      }
      uVar9 = 0x10;
    }
    else {
      uVar9 = uVar2 * 2;
      if ((int)uVar9 <= (int)uVar2) goto LAB_00647f2b;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar6 = malloc((ulong)uVar2 << 4);
      }
      else {
        pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
      }
    }
    *(void **)(__ptr + 2) = pvVar6;
    *__ptr = uVar9;
  }
LAB_00647f2b:
  __ptr[1] = uVar1 + 1;
  *(void **)(*(long *)(__ptr + 2) + lVar11 * 8) = pvVar5;
  uVar12 = uVar12 + 1;
  goto LAB_00647f3d;
  while (lVar11 = lVar11 + 1, vNodes->nSize != lVar11) {
LAB_00647ec9:
    if (vNodes->pArray[lVar11] == pvVar5) {
      local_50 = (ulong)((int)local_50 + 1);
      goto LAB_00647f3d;
    }
  }
LAB_00647ed7:
  local_54 = local_54 + 1;
LAB_00647f3d:
  lVar13 = lVar13 + 1;
  uVar8 = (ulong)vNodes_00->nSize;
  if ((long)uVar8 <= lVar13) goto LAB_00647f6c;
  goto LAB_00647e70;
}

Assistant:

void Saig_ManPrintConeOne( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vPrev, * vCur, * vTotal;
    int s, i, nCurNew, nCurPrev, nCurOld;
    assert( Saig_ObjIsPo(p, pObj) );
    // start the array
    vPrev = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vPrev, pObj );
    // get the current support
    vCur = Saig_ManSupport( p, vPrev );  
    Vec_PtrClear( vPrev );
    printf( "    PO %3d  ", Aig_ObjCioId(pObj) );
    // continue computing supports as long as there are now nodes
    vTotal = Vec_PtrAlloc( 100 );
    for ( s = 0; ; s++ )
    {
        // classify current into those new, prev, and older 
        nCurNew = nCurPrev = nCurOld = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vCur, pObj, i )
        {
            if ( Vec_PtrFind(vTotal, pObj) == -1 )
            {
                Vec_PtrPush( vTotal, pObj );
                nCurNew++;
            }
            else if ( Vec_PtrFind(vPrev, pObj) >= 0 )
                nCurPrev++;
            else
                nCurOld++;
        }
        assert( nCurNew + nCurPrev + nCurOld == Vec_PtrSize(vCur) );
        // print the result
        printf( "%d:%d %d=%d+%d+%d  ", s, Vec_PtrSize(vTotal), Vec_PtrSize(vCur), nCurNew, nCurPrev, nCurOld ); 
        if ( nCurNew == 0 )
            break;
        // compute one more step
        Vec_PtrFree( vPrev );
        vCur = Saig_ManSupport( p, vPrev = vCur );
    }
    printf( "\n" );
    Vec_PtrFree( vPrev );
    Vec_PtrFree( vCur );
    Vec_PtrFree( vTotal );
}